

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

void TransformColor_SSE2(VP8LMultipliers *m,uint32_t *argb_data,int num_pixels)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar6 = _DAT_00147820;
  iVar7 = (char)m->green_to_red_ * 0x80000 + ((int)(char)m->green_to_blue_ & 0x1fffU) * 8;
  auVar9._4_4_ = iVar7;
  auVar9._0_4_ = iVar7;
  auVar9._8_4_ = iVar7;
  auVar9._12_4_ = iVar7;
  iVar7 = (int)(char)m->red_to_blue_;
  auVar10._0_4_ = iVar7 << 0x13;
  auVar10._4_4_ = iVar7 << 0x13;
  auVar10._8_4_ = iVar7 << 0x13;
  auVar10._12_4_ = iVar7 << 0x13;
  lVar8 = 0;
  while (lVar8 + 4 <= (long)num_pixels) {
    auVar1 = *(undefined1 (*) [16])argb_data;
    auVar11 = pshuflw(in_XMM4,auVar1,0xe8);
    auVar11 = pshufhw(auVar11,auVar11,0xe8);
    auVar21._0_4_ = auVar11._0_4_;
    auVar21._8_4_ = auVar11._8_4_;
    auVar21._12_4_ = auVar11._12_4_;
    auVar21._4_4_ = auVar21._8_4_;
    auVar11 = pshuflw(auVar21,auVar21,0xd8);
    auVar19._0_14_ = auVar11._0_14_;
    auVar19[0xe] = auVar11[7];
    auVar19[0xf] = auVar11[7];
    auVar18._14_2_ = auVar19._14_2_;
    auVar18._0_13_ = auVar11._0_13_;
    auVar18[0xd] = auVar11[6];
    auVar17._13_3_ = auVar18._13_3_;
    auVar17._0_12_ = auVar11._0_12_;
    auVar17[0xc] = auVar11[6];
    auVar16._12_4_ = auVar17._12_4_;
    auVar16._0_11_ = auVar11._0_11_;
    auVar16[0xb] = auVar11[5];
    auVar15._11_5_ = auVar16._11_5_;
    auVar15._0_10_ = auVar11._0_10_;
    auVar15[10] = auVar11[5];
    auVar14._10_6_ = auVar15._10_6_;
    auVar14._0_9_ = auVar11._0_9_;
    auVar14[9] = auVar11[4];
    auVar13._9_7_ = auVar14._9_7_;
    auVar13._0_8_ = auVar11._0_8_;
    auVar13[8] = auVar11[4];
    auVar12._8_8_ = auVar13._8_8_;
    auVar12[7] = auVar11[3];
    auVar12[6] = auVar11[3];
    auVar12[5] = auVar11[2];
    auVar12[4] = auVar11[2];
    auVar12[3] = auVar11[1];
    auVar12[2] = auVar11[1];
    auVar12[0] = auVar11[0];
    auVar12[1] = auVar12[0];
    auVar11 = pshuflw(auVar12,auVar12,0xe7);
    auVar11 = pshufhw(auVar11,auVar11,0xe7);
    auVar20._0_4_ = auVar11._0_4_;
    auVar20._8_4_ = auVar11._8_4_;
    auVar20._12_4_ = auVar11._12_4_;
    auVar20._4_4_ = auVar20._8_4_;
    auVar21 = pshuflw(auVar20,auVar20,0x8d);
    auVar3[10] = 0;
    auVar3._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar3[0xb] = auVar21[5];
    auVar4[9] = auVar21[4];
    auVar4._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar4._10_2_ = auVar3._10_2_;
    auVar5._9_3_ = auVar4._9_3_;
    auVar5._0_9_ = (unkuint9)0;
    auVar2._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar5._8_4_,auVar21[3])) << 0x38,6);
    auVar2[0] = auVar21[2];
    auVar2._11_5_ = 0;
    auVar23._1_12_ = SUB1612(auVar2 << 0x28,4);
    auVar23[0] = auVar21[1];
    auVar23._13_3_ = 0;
    auVar11._1_14_ = SUB1614(auVar23 << 0x18,2);
    auVar11[0] = auVar21[0];
    auVar11[0xf] = 0;
    auVar23 = pmulhw(auVar11 << 8,auVar9);
    auVar11 = psllw(auVar1,8);
    auVar11 = pmulhw(auVar11,auVar10);
    auVar22[0] = auVar11[2] + auVar23[0];
    auVar22[1] = auVar11[3] + auVar23[1];
    auVar22[2] = auVar23[2];
    auVar22[3] = auVar23[3];
    auVar22[4] = auVar11[6] + auVar23[4];
    auVar22[5] = auVar11[7] + auVar23[5];
    auVar22[6] = auVar23[6];
    auVar22[7] = auVar23[7];
    auVar22[8] = auVar11[10] + auVar23[8];
    auVar22[9] = auVar11[0xb] + auVar23[9];
    auVar22[10] = auVar23[10];
    auVar22[0xb] = auVar23[0xb];
    auVar22[0xc] = auVar11[0xe] + auVar23[0xc];
    auVar22[0xd] = auVar11[0xf] + auVar23[0xd];
    auVar22[0xe] = auVar23[0xe];
    auVar22[0xf] = auVar23[0xf];
    in_XMM4 = auVar22 & auVar6;
    (*(undefined1 (*) [16])argb_data)[0] = auVar1[0] - in_XMM4[0];
    (*(undefined1 (*) [16])argb_data)[1] = auVar1[1] - in_XMM4[1];
    (*(undefined1 (*) [16])argb_data)[2] = auVar1[2] - in_XMM4[2];
    (*(undefined1 (*) [16])argb_data)[3] = auVar1[3] - in_XMM4[3];
    (*(undefined1 (*) [16])argb_data)[4] = auVar1[4] - in_XMM4[4];
    (*(undefined1 (*) [16])argb_data)[5] = auVar1[5] - in_XMM4[5];
    (*(undefined1 (*) [16])argb_data)[6] = auVar1[6] - in_XMM4[6];
    (*(undefined1 (*) [16])argb_data)[7] = auVar1[7] - in_XMM4[7];
    (*(undefined1 (*) [16])argb_data)[8] = auVar1[8] - in_XMM4[8];
    (*(undefined1 (*) [16])argb_data)[9] = auVar1[9] - in_XMM4[9];
    (*(undefined1 (*) [16])argb_data)[10] = auVar1[10] - in_XMM4[10];
    (*(undefined1 (*) [16])argb_data)[0xb] = auVar1[0xb] - in_XMM4[0xb];
    (*(undefined1 (*) [16])argb_data)[0xc] = auVar1[0xc] - in_XMM4[0xc];
    (*(undefined1 (*) [16])argb_data)[0xd] = auVar1[0xd] - in_XMM4[0xd];
    (*(undefined1 (*) [16])argb_data)[0xe] = auVar1[0xe] - in_XMM4[0xe];
    (*(undefined1 (*) [16])argb_data)[0xf] = auVar1[0xf] - in_XMM4[0xf];
    argb_data = (uint32_t *)((long)argb_data + 0x10);
    lVar8 = lVar8 + 4;
  }
  if (num_pixels == (int)lVar8) {
    return;
  }
  VP8LTransformColor_C(m,argb_data,num_pixels - (int)lVar8);
  return;
}

Assistant:

static void TransformColor_SSE2(const VP8LMultipliers* const m,
                                uint32_t* argb_data, int num_pixels) {
  const __m128i mults_rb = MK_CST_16(CST_5b(m->green_to_red_),
                                     CST_5b(m->green_to_blue_));
  const __m128i mults_b2 = MK_CST_16(CST_5b(m->red_to_blue_), 0);
  const __m128i mask_ag = _mm_set1_epi32(0xff00ff00);  // alpha-green masks
  const __m128i mask_rb = _mm_set1_epi32(0x00ff00ff);  // red-blue masks
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((__m128i*)&argb_data[i]); // argb
    const __m128i A = _mm_and_si128(in, mask_ag);     // a   0   g   0
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // g0g0
    const __m128i D = _mm_mulhi_epi16(C, mults_rb);    // x dr  x db1
    const __m128i E = _mm_slli_epi16(in, 8);           // r 0   b   0
    const __m128i F = _mm_mulhi_epi16(E, mults_b2);    // x db2 0   0
    const __m128i G = _mm_srli_epi32(F, 16);           // 0 0   x db2
    const __m128i H = _mm_add_epi8(G, D);              // x dr  x  db
    const __m128i I = _mm_and_si128(H, mask_rb);       // 0 dr  0  db
    const __m128i out = _mm_sub_epi8(in, I);
    _mm_storeu_si128((__m128i*)&argb_data[i], out);
  }
  // fallthrough and finish off with plain-C
  if (i != num_pixels) {
    VP8LTransformColor_C(m, argb_data + i, num_pixels - i);
  }
}